

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

uint RDL_translateCycArray(RDL_data *data,RDL_cycle **array,uint number,char ***ptr)

{
  uint uVar1;
  char **ppcVar2;
  char **result;
  uint local_38;
  uint RDL_edgeIdx;
  uint j;
  uint i;
  char ***ptr_local;
  uint number_local;
  RDL_cycle **array_local;
  RDL_data *data_local;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    ppcVar2 = RDL_alloc2DCharArray(0,0);
    *ptr = ppcVar2;
    data_local._4_4_ = 0xffffffff;
  }
  else if (number == 0) {
    ppcVar2 = RDL_alloc2DCharArray(0,0);
    *ptr = ppcVar2;
    data_local._4_4_ = 0;
  }
  else {
    ppcVar2 = RDL_alloc2DCharArray(number,data->graph->E);
    for (RDL_edgeIdx = 0; RDL_edgeIdx < number; RDL_edgeIdx = RDL_edgeIdx + 1) {
      for (local_38 = 0; local_38 < data->graph->E; local_38 = local_38 + 1) {
        ppcVar2[RDL_edgeIdx][local_38] = '\0';
      }
    }
    for (RDL_edgeIdx = 0; RDL_edgeIdx < number; RDL_edgeIdx = RDL_edgeIdx + 1) {
      for (local_38 = 0; local_38 < array[RDL_edgeIdx]->weight; local_38 = local_38 + 1) {
        uVar1 = RDL_edgeId(data->graph,array[RDL_edgeIdx]->edges[local_38][0],
                           array[RDL_edgeIdx]->edges[local_38][1]);
        ppcVar2[RDL_edgeIdx][uVar1] = '\x01';
      }
    }
    *ptr = ppcVar2;
    data_local._4_4_ = number;
  }
  return data_local._4_4_;
}

Assistant:

unsigned RDL_translateCycArray(const RDL_data *data, RDL_cycle **array,
                               unsigned number, char ***ptr)
{
  unsigned i,j,RDL_edgeIdx;
  char **result;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*ptr) = RDL_alloc2DCharArray(0, 0);
    return RDL_INVALID_RESULT;
  }

  if (number < 1) {
    (*ptr) = RDL_alloc2DCharArray(0, 0);
    return 0;
  }

  result = RDL_alloc2DCharArray(number, data->graph->E);
  for(i=0; i<number;  ++i)/*initialize to 0s*/
  {
    for(j=0; j<data->graph->E; ++j)
    {
      result[i][j] = 0;
    }
  }

  for(i=0; i<number; ++i)
  {
    for(j=0; j<array[i]->weight; ++j)
    {
      RDL_edgeIdx = RDL_edgeId(data->graph, array[i]->edges[j][0],
                               array[i]->edges[j][1]);
      result[i][RDL_edgeIdx] = 1;
    }
  }
  (*ptr) = result;
  return number;
}